

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objtracker.cpp
# Opt level: O2

void CObjectTracker::ReportHelper(string *label,CTracker *tracker,ostream *os)

{
  ulong uVar1;
  __int_type _Var2;
  ulong uVar3;
  ostream *poVar4;
  char *pcVar5;
  
  _Var2 = (tracker->NumAllocations).super___atomic_base<unsigned_long>._M_i;
  uVar3 = (tracker->NumReleases).super___atomic_base<unsigned_long>._M_i;
  uVar1 = (tracker->NumRetains).super___atomic_base<unsigned_long>._M_i + _Var2;
  if (uVar3 < uVar1) {
    pcVar5 = "Possible leak of type ";
  }
  else {
    if (uVar3 <= uVar1) {
      if (_Var2 == 0) {
        return;
      }
      poVar4 = std::operator<<(os,"No ");
      poVar4 = std::operator<<(poVar4,(string *)label);
      poVar4 = std::operator<<(poVar4," leaks detected.");
      goto LAB_00183895;
    }
    pcVar5 = "Unexpected counts for type ";
  }
  poVar4 = std::operator<<(os,pcVar5);
  poVar4 = std::operator<<(poVar4,(string *)label);
  poVar4 = std::operator<<(poVar4,"!");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(os,"    Number of Allocations: ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(os,"    Number of Retains:     ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(os,"    Number of Releases:    ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
LAB_00183895:
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void CObjectTracker::ReportHelper(
    const std::string& label,
    const CObjectTracker::CTracker& tracker,
    std::ostream& os )
{
    size_t  numAllocations = tracker.NumAllocations.load(std::memory_order_relaxed);
    size_t  numRetains = tracker.NumRetains.load(std::memory_order_relaxed);
    size_t  numReleases = tracker.NumReleases.load(std::memory_order_relaxed);

    if( numReleases < numAllocations + numRetains )
    {
        os << "Possible leak of type " << label << "!" << std::endl;
        os << "    Number of Allocations: " << numAllocations << std::endl;
        os << "    Number of Retains:     " << numRetains << std::endl;
        os << "    Number of Releases:    " << numReleases << std::endl;
    }
    else if( numReleases > numAllocations + numRetains )
    {
        // If there are more releases than allocations or retains then this
        // is an unexpected situation.  It usually means that some allocations
        // aren't tracked correctly, or that a retain or release returned
        // an error.
        os << "Unexpected counts for type " << label << "!" << std::endl;
        os << "    Number of Allocations: " << numAllocations << std::endl;
        os << "    Number of Retains:     " << numRetains << std::endl;
        os << "    Number of Releases:    " << numReleases << std::endl;
    }
    else if( numAllocations )
    {
        os << "No " << label << " leaks detected." << std::endl;
    }
}